

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O2

Region * __thiscall
remote::Handle::GetRegionByAddress(Region *__return_storage_ptr__,Handle *this,size_t address)

{
  bool bVar1;
  pointer pRVar2;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> local_b8;
  Region local_a0;
  
  (__return_storage_ptr__->pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pathname).field_2;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->pathname)._M_string_length = 0;
  (__return_storage_ptr__->pathname).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->start = 0;
  __return_storage_ptr__->end = 0;
  __return_storage_ptr__->read = false;
  __return_storage_ptr__->write = false;
  __return_storage_ptr__->exec = false;
  __return_storage_ptr__->shared = false;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->deviceMajor = 0;
  __return_storage_ptr__->deviceMinor = 0;
  __return_storage_ptr__->inodeFileNumber = 0;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  if (this->pid != -1) {
    bVar1 = IsRunning(this);
    if (bVar1) {
      GetRegions(&local_b8,this);
      for (pRVar2 = local_b8.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar2 != local_b8.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pRVar2 = pRVar2 + 1) {
        Region::Region(&local_a0,pRVar2);
        if ((address <= local_a0.start) && (address <= local_a0.end)) {
          Region::operator=(__return_storage_ptr__,&local_a0);
        }
        Region::~Region(&local_a0);
      }
      std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Region Handle::GetRegionByAddress(size_t address) {
    Region r;

    if(IsValid() && IsRunning()) {
        vector<Region> regions = GetRegions();

        for(auto reg : regions) {
            if(reg.start >= address && address <= reg.end) {
                r = reg;
            }
        }
    }

    return r;
}